

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::~IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this)

{
  void *pvVar1;
  undefined1 *puVar2;
  
  this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr.field_2.
  _M_allocated_capacity = (size_type)&PTR__IfcRelContainedInSpatialStructure_008b6910;
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.OwnerHistory.obj =
       (LazyObject *)&PTR__IfcRelContainedInSpatialStructure_008b69b0;
  this[-1].RelatingStructure.obj = (LazyObject *)&PTR__IfcRelContainedInSpatialStructure_008b6938;
  *(undefined ***)&this[-1].field_0xe0 = &PTR__IfcRelContainedInSpatialStructure_008b6960;
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelContainedInSpatialStructure_008b6988;
  pvVar1 = *(void **)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr.field_2.
  _M_allocated_capacity = 0x8b6ba0;
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.OwnerHistory.obj =
       (LazyObject *)
       (IfcRoot-in-Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::construction_vtable +
       0x40);
  puVar2 = *(undefined1 **)&this[-1].super_IfcRelConnects.super_IfcRelationship.field_0xa8;
  if (puVar2 != &this[-1].super_IfcRelConnects.field_0xb8) {
    operator_delete(puVar2);
  }
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Description.have;
  if (puVar2 != &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.field_0x90) {
    operator_delete(puVar2);
  }
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.have;
  if ((size_type *)puVar2 !=
      &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Description.ptr.
       _M_string_length) {
    operator_delete(puVar2);
  }
  operator_delete(&this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr.
                   field_2);
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}